

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-batched.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  gpt2_batch batch;
  gpt2_batch batch_00;
  gpt2_batch batch_01;
  uint uVar2;
  pointer pfVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  time_t tVar8;
  long lVar9;
  undefined8 uVar10;
  ggml_gallocr_t allocr;
  ggml_cgraph *pgVar11;
  mapped_type *pmVar12;
  size_t __i;
  long lVar13;
  ulong __n;
  _Base_ptr p_Var14;
  _Base_ptr p_Var15;
  ulong uVar16;
  uint uVar17;
  _Rb_tree_header *p_Var18;
  ulong uVar19;
  int in_R8D;
  uint uVar20;
  ulong uVar21;
  float fVar22;
  undefined1 auVar23 [16];
  id id;
  vector<int,_std::allocator<int>_> embd_inp;
  vector<float,_std::allocator<float>_> logits;
  vector<int,_std::allocator<int>_> i_batch;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  streams;
  gpt_params params;
  gpt_vocab vocab;
  mt19937 rng;
  undefined4 in_stack_ffffffffffffe918;
  int local_16e0;
  float local_16cc;
  uint local_16c8;
  allocator_type local_16c1;
  vector<int,_std::allocator<int>_> local_16c0;
  long local_16a8;
  int local_169c;
  gpt2_batch local_1698;
  vector<float,_std::allocator<float>_> local_1668;
  ggml_gallocr_t local_1648;
  vector<int,_std::allocator<int>_> local_1640;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1628;
  long local_1610;
  long local_1608;
  long local_1600;
  ulong local_15f8;
  gpt2_seq_id *local_15f0;
  gpt2_pos *local_15e8;
  id *local_15e0;
  int8_t *local_15d8;
  double local_15d0;
  double local_15c8;
  long local_15c0;
  gpt_params local_15b8;
  undefined1 local_1518 [72];
  pointer local_14d0;
  pointer pgStack_14c8;
  pointer local_14c0;
  undefined8 local_14a8;
  uint32_t local_14a0;
  vector<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_> local_1498;
  ggml_backend_buffer_t local_1480;
  ggml_context *local_1478;
  ggml_backend_t local_1470;
  ggml_backend_buffer_t local_1468;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
  local_1460;
  gpt_vocab local_1430;
  mt19937 local_13b8;
  
  ggml_time_init();
  lVar7 = ggml_time_us();
  gpt_params::gpt_params(&local_15b8);
  bVar4 = gpt_params_parse(argc,argv,&local_15b8);
  iVar5 = 1;
  if (bVar4) {
    if (local_15b8.seed < 0) {
      tVar8 = time((time_t *)0x0);
      local_15b8.seed = (int32_t)tVar8;
    }
    printf("%s: seed = %d\n","main");
    local_13b8._M_x[0] = (unsigned_long)(uint)local_15b8.seed;
    lVar13 = 1;
    uVar16 = local_13b8._M_x[0];
    do {
      uVar16 = (ulong)(((uint)(uVar16 >> 0x1e) ^ (uint)uVar16) * 0x6c078965 + (int)lVar13);
      local_13b8._M_x[lVar13] = uVar16;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x270);
    local_13b8._M_p = 0x270;
    if (local_15b8.prompt._M_string_length == 0) {
      gpt_random_prompt_abi_cxx11_((string *)local_1518,&local_13b8);
      std::__cxx11::string::operator=((string *)&local_15b8.prompt,(string *)local_1518);
      if ((undefined1 *)local_1518._0_8_ != local_1518 + 0x10) {
        operator_delete((void *)local_1518._0_8_,local_1518._16_8_ + 1);
      }
    }
    local_1430.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1430.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1430.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1430.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1430.token_to_id._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1430.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1430.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1430.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1430.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1430.id_to_token._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1430.special_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1430.special_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1430.special_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1460._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1460._M_impl.super__Rb_tree_header._M_header;
    local_1518._0_8_ = (pointer)0x4000000c451;
    local_1518._8_8_ = 0xc00000300;
    local_1518._16_8_ = 0x10000000c;
    local_1518._24_4_ = 0x3727c5ac;
    local_14d0 = (pointer)0x0;
    pgStack_14c8 = (pointer)0x0;
    local_14c0 = (pointer)0x0;
    local_14a8 = 0;
    local_14a0 = 0;
    local_1498.super__Vector_base<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1498.super__Vector_base<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1498.super__Vector_base<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1470 = (ggml_backend_t)0x0;
    local_1460._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1460._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1460._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1460._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1460._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1430.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1430.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1430.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1430.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    lVar13 = ggml_time_us();
    bVar4 = gpt2_model_load(&local_15b8.model,(gpt2_model *)local_1518,&local_1430,local_15b8.n_ctx,
                            in_R8D);
    if (bVar4) {
      lVar9 = ggml_time_us();
      test_gpt_tokenizer(&local_1430,&local_15b8.token_test);
      gpt_tokenize(&local_16c0,&local_1430,&local_15b8.prompt);
      __n = (ulong)local_15b8.n_parallel;
      uVar16 = (long)local_16c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_16c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
      if (uVar16 <= __n) {
        uVar16 = __n;
      }
      gpt2_batch_init(&local_1698,(int32_t)uVar16,0);
      uVar10 = ggml_backend_get_default_buffer_type(local_1470);
      allocr = (ggml_gallocr_t)ggml_gallocr_new(uVar10);
      local_1698.n_tokens = (int32_t)uVar16;
      pgVar11 = gpt2_graph((gpt2_model *)local_1518,&local_1698,true);
      ggml_gallocr_reserve(allocr,pgVar11);
      uVar10 = ggml_gallocr_get_buffer_size(allocr,0);
      auVar23._8_4_ = (int)((ulong)uVar10 >> 0x20);
      auVar23._0_8_ = uVar10;
      auVar23._12_4_ = 0x45300000;
      fprintf(_stderr,"%s: compute buffer size: %.2f MB\n",
              SUB84(((auVar23._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0)) * 0.0009765625
                    * 0.0009765625,0),"main");
      local_1668.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_1668.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_1668.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      uVar16 = (ulong)((long)local_16c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)local_16c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2;
      uVar20 = (uint)uVar16;
      if (0 < (int)uVar20) {
        uVar19 = 0;
        do {
          local_1698.token[uVar19] =
               local_16c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar19];
          local_1698.pos[uVar19] = (gpt2_pos)uVar19;
          local_1698.seq_id[uVar19] = 0;
          local_1698.logits[uVar19] = '\0';
          uVar19 = uVar19 + 1;
        } while ((uVar20 & 0x7fffffff) != uVar19);
      }
      local_15d8 = local_1698.logits;
      local_1698.logits[(long)(int)uVar20 + -1] = '\x01';
      batch._4_4_ = local_1698._4_4_;
      batch.n_tokens = uVar20;
      batch.token = local_1698.token;
      batch.embd = local_1698.embd;
      batch.pos = local_1698.pos;
      batch.seq_id = local_1698.seq_id;
      batch.logits = local_1698.logits;
      local_1698.n_tokens = uVar20;
      iVar5 = gpt2_decode((gpt2_model *)local_1518,allocr,batch,local_15b8.n_threads,&local_1668);
      if (iVar5 == 0) {
        local_1608 = lVar9;
        local_1600 = lVar13;
        if (1 < local_15b8.n_parallel) {
          uVar17 = 0x7fffffff;
          if (uVar20 < 0x7fffffff) {
            uVar17 = uVar20;
          }
          iVar5 = 1;
          uVar2 = local_14a8._4_4_;
          do {
            uVar19 = (ulong)uVar2;
            uVar6 = 0;
            local_1628.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start._0_4_ = iVar5;
            if (uVar2 != 0) {
              uVar21 = 0;
              do {
                p_Var14 = local_1498.super__Vector_base<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar21].seq_id._M_t._M_impl.
                          super__Rb_tree_header._M_header._M_parent;
                if (p_Var14 != (_Base_ptr)0x0) {
                  p_Var18 = &local_1498.
                             super__Vector_base<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_>._M_impl
                             .super__Vector_impl_data._M_start[uVar21].seq_id._M_t._M_impl.
                             super__Rb_tree_header;
                  p_Var15 = &p_Var18->_M_header;
                  do {
                    if (-1 < (int)p_Var14[1]._M_color) {
                      p_Var15 = p_Var14;
                    }
                    p_Var14 = (&p_Var14->_M_left)[p_Var14[1]._M_color >> 0x1f];
                  } while (p_Var14 != (_Base_ptr)0x0);
                  if ((((_Rb_tree_header *)p_Var15 != p_Var18) && ((int)p_Var15[1]._M_color < 1)) &&
                     ((uint)local_1498.
                            super__Vector_base<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar21].pos < uVar17)) {
                    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                    _M_insert_unique<int_const&>
                              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                *)&local_1498.
                                   super__Vector_base<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_>.
                                   _M_impl.super__Vector_impl_data._M_start[uVar21].seq_id,
                               (int *)&local_1628);
                    uVar19 = local_14a8 >> 0x20;
                  }
                }
                uVar21 = uVar21 + 1;
                uVar6 = (uint)uVar19;
              } while (uVar21 < uVar19);
            }
            iVar5 = iVar5 + 1;
            uVar2 = uVar6;
          } while (iVar5 != local_15b8.n_parallel);
          if (1 < local_15b8.n_parallel) {
            printf("\n\n%s: generating %d sequences ...\n","main");
          }
        }
        iVar5 = local_1518._4_4_ -
                (int)((ulong)((long)local_16c0.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                    .super__Vector_impl_data._M_finish -
                             (long)local_16c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2);
        if (local_15b8.n_predict <= iVar5) {
          iVar5 = local_15b8.n_predict;
        }
        local_15b8.n_predict = iVar5;
        printf("%s: prompt: \'%s\'\n","main",local_15b8.prompt._M_dataplus._M_p);
        printf("%s: number of tokens in prompt = %zu, first 8 tokens: ","main",
               (long)local_16c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_16c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2);
        if (0 < (int)((ulong)((long)local_16c0.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                    .super__Vector_impl_data._M_finish -
                             (long)local_16c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2)) {
          lVar13 = 0;
          do {
            printf("%d ",(ulong)(uint)local_16c0.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start[lVar13]);
            lVar13 = lVar13 + 1;
            iVar5 = (int)((ulong)((long)local_16c0.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_16c0.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start) >> 2);
            if (7 < iVar5) {
              iVar5 = 8;
            }
          } while (lVar13 < iVar5);
        }
        puts("\n");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_1628,__n,(allocator_type *)&local_1640);
        iVar5 = uVar20 - 1;
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_1640,__n,(value_type_conflict2 *)&stack0xffffffffffffe91c,&local_16c1);
        if (local_15b8.n_predict < 1) {
          local_16c8 = 0;
          fVar22 = 0.0;
          local_16cc = 0.0;
        }
        else {
          local_15f8 = (ulong)(local_15b8.n_predict + uVar20);
          local_15c0 = (long)(int)local_1518._0_4_;
          local_15c8 = (double)local_15b8.top_p;
          local_15d0 = (double)local_15b8.temp;
          local_169c = (local_15b8.n_predict + uVar20) - 1;
          local_15e0 = local_1698.token;
          local_15e8 = local_1698.pos;
          local_15f0 = local_1698.seq_id;
          lVar13 = 0;
          local_16a8 = 0;
          local_16c8 = 0;
          local_1648 = allocr;
          local_1610 = lVar7;
          do {
            if (local_15b8.n_parallel < 1) {
              local_1698.n_tokens = 0;
              break;
            }
            uVar19 = 0;
            uVar20 = 0;
            do {
              pfVar3 = local_1668.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start;
              iVar1 = local_1640.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar19];
              local_16e0 = (int)uVar16;
              if (-1 < (long)iVar1) {
                lVar7 = ggml_time_us();
                iVar5 = gpt_sample_top_k_top_p
                                  (&local_1430,pfVar3 + iVar1 * local_15c0,local_15b8.top_k,
                                   local_15c8,local_15d0,&local_13b8);
                lVar9 = ggml_time_us();
                if (((~local_15b8.ignore_eos & iVar5 == 0xc450) == 0) && (local_16e0 != local_169c))
                {
                  pmVar12 = std::
                            map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator[](&local_1430.id_to_token,
                                         (key_type *)&stack0xffffffffffffe91c);
                  if (local_15b8.n_parallel == 1) {
                    printf("%s",(pmVar12->_M_dataplus)._M_p);
                    fflush(_stdout);
                  }
                  std::__cxx11::string::_M_append
                            ((char *)(uVar19 * 0x20 +
                                     CONCAT44(local_1628.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                              (int)local_1628.
                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)),
                             (ulong)(pmVar12->_M_dataplus)._M_p);
                  local_15e0[(int)uVar20] = iVar5;
                  local_15e8[(int)uVar20] = local_16e0;
                  local_15f0[(int)uVar20] = (gpt2_seq_id)uVar19;
                  local_15d8[(int)uVar20] = '\x01';
                  local_1640.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar19] = uVar20;
                  uVar20 = uVar20 + 1;
                  local_16c8 = local_16c8 + 1;
                }
                else {
                  local_1640.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar19] = -1;
                  putchar(10);
                  if (1 < local_15b8.n_parallel) {
                    printf("%s: stream %d finished at n_cur = %d","main",uVar19 & 0xffffffff,uVar16)
                    ;
                  }
                }
                lVar13 = (lVar13 - lVar7) + lVar9;
              }
              uVar19 = uVar19 + 1;
            } while (uVar19 != __n);
            allocr = local_1648;
            local_1698.n_tokens = uVar20;
            if (uVar20 == 0) break;
            lVar7 = ggml_time_us();
            allocr = local_1648;
            batch_00._4_4_ = local_1698._4_4_;
            batch_00.n_tokens = local_1698.n_tokens;
            batch_00.token = local_1698.token;
            batch_00.embd = local_1698.embd;
            batch_00.pos = local_1698.pos;
            batch_00.seq_id = local_1698.seq_id;
            batch_00.logits = local_1698.logits;
            uVar20 = gpt2_decode((gpt2_model *)local_1518,local_1648,batch_00,local_15b8.n_threads,
                                 &local_1668);
            uVar19 = local_15f8;
            if (uVar20 != 0) {
              fprintf(_stderr,"%s : failed to eval, return code %d\n","main",(ulong)uVar20);
              iVar5 = 1;
              goto LAB_0010b60a;
            }
            lVar9 = ggml_time_us();
            uVar16 = (ulong)(local_16e0 + 1U);
            local_16a8 = (local_16a8 - lVar7) + lVar9;
          } while ((int)(local_16e0 + 1U) < (int)uVar19);
          local_16cc = (float)lVar13;
          fVar22 = (float)local_16a8;
          lVar7 = local_1610;
        }
        if (1 < local_15b8.n_parallel) {
          putchar(10);
          lVar13 = 0;
          uVar20 = 0;
          do {
            printf("sequence %d:\n\n%s%s\n\n",(ulong)uVar20,local_15b8.prompt._M_dataplus._M_p,
                   *(undefined8 *)
                    (CONCAT44(local_1628.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                              (int)local_1628.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) + lVar13));
            uVar20 = uVar20 + 1;
            lVar13 = lVar13 + 0x20;
          } while (__n << 5 != lVar13);
        }
        lVar13 = ggml_time_us();
        lVar9 = local_1608 - local_1600;
        puts("\n");
        printf("%s:     n_decoded = %8d\n","main",(ulong)local_16c8);
        printf("%s:     load time = %8.2f ms\n",SUB84((double)((float)lVar9 / 1000.0),0),"main");
        printf("%s:   sample time = %8.2f ms\n",SUB84((double)(local_16cc / 1000.0),0),"main");
        printf("%s:  predict time = %8.2f ms\n",SUB84((double)(fVar22 / 1000.0),0),"main");
        printf("%s:    total time = %8.2f ms\n",SUB84((double)((float)(lVar13 - lVar7) / 1000.0),0),
               "main");
        batch_01.token = (id *)local_1698.embd;
        batch_01._0_8_ = local_1698.token;
        batch_01.embd = (float *)local_1698.pos;
        batch_01.pos = local_1698.seq_id;
        batch_01.seq_id = (gpt2_seq_id *)local_1698.logits;
        batch_01.logits._0_4_ = in_stack_ffffffffffffe918;
        batch_01.logits._4_4_ = iVar5;
        gpt2_batch_free(batch_01);
        ggml_free(local_1478);
        ggml_gallocr_free(allocr);
        ggml_backend_buffer_free(local_1468);
        ggml_backend_buffer_free(local_1480);
        iVar5 = 0;
        ggml_backend_free(local_1470);
LAB_0010b60a:
        if (local_1640.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start != (pointer)0x0) {
          operator_delete(local_1640.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1640.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_1640.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1628);
      }
      else {
        printf("%s: gpt2_decode() failed\n","main");
        iVar5 = 1;
      }
      if (local_1668.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1668.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1668.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1668.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_16c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_16c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_16c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_16c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    else {
      main_cold_1();
      iVar5 = 1;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
    ::~_Rb_tree(&local_1460);
    std::vector<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_>::~vector(&local_1498);
    if (local_14d0 != (pointer)0x0) {
      operator_delete(local_14d0,(long)local_14c0 - (long)local_14d0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1430.special_tokens);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_1430.id_to_token._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 *)&local_1430);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15b8.token_test._M_dataplus._M_p != &local_15b8.token_test.field_2) {
    operator_delete(local_15b8.token_test._M_dataplus._M_p,
                    local_15b8.token_test.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15b8.prompt._M_dataplus._M_p != &local_15b8.prompt.field_2) {
    operator_delete(local_15b8.prompt._M_dataplus._M_p,
                    local_15b8.prompt.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15b8.model._M_dataplus._M_p != &local_15b8.model.field_2) {
    operator_delete(local_15b8.model._M_dataplus._M_p,
                    local_15b8.model.field_2._M_allocated_capacity + 1);
  }
  return iVar5;
}

Assistant:

int main(int argc, char ** argv) {
    ggml_time_init();

    const int64_t t_main_start_us = ggml_time_us();

    gpt_params params;

    if (gpt_params_parse(argc, argv, params) == false) {
        return 1;
    }

    if (params.seed < 0) {
        params.seed = time(NULL);
    }

    printf("%s: seed = %d\n", __func__, params.seed);

    std::mt19937 rng(params.seed);
    if (params.prompt.empty()) {
        params.prompt = gpt_random_prompt(rng);
    }

    int64_t t_load_us = 0;

    gpt_vocab vocab;
    gpt2_model model;

    // load the model
    {
        const int64_t t_start_us = ggml_time_us();

        if (!gpt2_model_load(params.model, model, vocab, params.n_ctx, params.n_gpu_layers)) {
            fprintf(stderr, "%s: failed to load model from '%s'\n", __func__, params.model.c_str());
            return 1;
        }

        t_load_us = ggml_time_us() - t_start_us;

        test_gpt_tokenizer(vocab, params.token_test);
    }

    // tokenize the prompt
    std::vector<gpt_vocab::id> embd_inp = ::gpt_tokenize(vocab, params.prompt);

    const int n_parallel = params.n_parallel;
    const int n_batch_max = std::max(embd_inp.size(), (size_t)n_parallel);

    // create a gpt2_batch
    // we use this object to submit token data for decoding
    gpt2_batch batch = gpt2_batch_init(n_batch_max, 0);

    // prepare required memory and allocate the compute buffer
    ggml_gallocr_t allocr = NULL;
    {
        // create an allocator to measure the memory usage
        allocr = ggml_gallocr_new(ggml_backend_get_default_buffer_type(model.backend));

        // create the worst case graph for memory usage estimation
        batch.n_tokens = n_batch_max;
        struct ggml_cgraph * gf = gpt2_graph(model, batch, true);

        // pre-allocate the compute buffer for the worst case (optional)
        ggml_gallocr_reserve(allocr, gf);
        size_t mem_size = ggml_gallocr_get_buffer_size(allocr, 0);
        fprintf(stderr, "%s: compute buffer size: %.2f MB\n", __func__, mem_size/1024.0/1024.0);
    }

    int64_t t_sample_us  = 0;
    int64_t t_predict_us = 0;

    std::vector<float> logits;

    // evaluate the initial prompt
    batch.n_tokens = embd_inp.size();

    for (int32_t i = 0; i < batch.n_tokens; i++) {
        batch.token[i]  = embd_inp[i];
        batch.pos[i]    = i;
        batch.seq_id[i] = 0;
        batch.logits[i] = false;
    }

    // gpt2_decode will output logits only for the last token of the prompt
    batch.logits[batch.n_tokens - 1] = true;

    if (gpt2_decode(model, allocr, batch, params.n_threads, logits) != 0) {
        printf("%s: gpt2_decode() failed\n", __func__);
        return 1;
    }

    // assign the system KV cache to all parallel sequences
    // this way, the parallel sequences will "reuse" the prompt tokens without having to copy them
    for (int32_t i = 1; i < n_parallel; ++i) {
        gpt2_kv_cache_seq_cp(model.kv_cache, 0, i, 0, batch.n_tokens);
    }

    if (n_parallel > 1) {
        printf("\n\n%s: generating %d sequences ...\n", __func__, n_parallel);
    }

    params.n_predict = std::min(params.n_predict, model.hparams.n_ctx - (int) embd_inp.size());

    printf("%s: prompt: '%s'\n", __func__, params.prompt.c_str());
    printf("%s: number of tokens in prompt = %zu, first 8 tokens: ", __func__, embd_inp.size());
    for (int i = 0; i < std::min(8, (int) embd_inp.size()); i++) {
        printf("%d ", embd_inp[i]);
    }
    printf("\n\n");

    std::vector<gpt_vocab::token> streams(n_parallel);

    // remember the batch index of the last token for each parallel sequence
    // we need this to determine which logits to sample from
    std::vector<int32_t> i_batch(n_parallel, batch.n_tokens - 1);

    int n_cur     = batch.n_tokens;
    int n_len     = batch.n_tokens + params.n_predict;
    int n_decoded = 0;

    const int   n_vocab = model.hparams.n_vocab;
    const int   top_k = params.top_k;
    const float top_p = params.top_p;
    const float temp  = params.temp;

    while (n_cur < n_len) {
        batch.n_tokens = 0;

        for (int32_t i = 0; i < n_parallel; ++i) {
            if (i_batch[i] < 0) {
                // the stream has already finished
                continue;
            }

            auto * logits_i = logits.data() + i_batch[i]*n_vocab;

            gpt_vocab::id id = 0;
            {
                const int64_t t_start_sample_us = ggml_time_us();

                id = gpt_sample_top_k_top_p(vocab, logits_i, top_k, top_p, temp, rng);

                t_sample_us += ggml_time_us() - t_start_sample_us;
            }

            // is it an end of stream? -> mark the stream as finished
            if ((!params.ignore_eos && id == 50256) || n_cur == n_len - 1) {
                i_batch[i] = -1;
                printf("\n");
                if (n_parallel > 1) {
                    printf("%s: stream %d finished at n_cur = %d", __func__, i, n_cur);
                }

                continue;
            }

            auto& token = vocab.id_to_token[id];
            if (n_parallel == 1) {
                printf("%s", token.c_str());
                fflush(stdout);
            }

            streams[i] += token;

            // push this new token for next evaluation
            batch.token [batch.n_tokens] = id;
            batch.pos   [batch.n_tokens] = n_cur;
            batch.seq_id[batch.n_tokens] = i;
            batch.logits[batch.n_tokens] = true;

            i_batch[i] = batch.n_tokens;

            batch.n_tokens += 1;

            n_decoded += 1;
        }

        // all streams are finished
        if (batch.n_tokens == 0) {
            break;
        }

        n_cur += 1;

        {
            const int64_t t_start_us = ggml_time_us();

            // evaluate the current batch with the transformer model
            int ret_code = gpt2_decode(model, allocr, batch, params.n_threads, logits);
            if (ret_code != 0) {
                fprintf(stderr, "%s : failed to eval, return code %d\n", __func__, ret_code);
                return 1;
            }

            t_predict_us += ggml_time_us() - t_start_us;
        }
    }

    if (n_parallel > 1) {
        printf("\n");

        for (int32_t i = 0; i < n_parallel; ++i) {
            printf("sequence %d:\n\n%s%s\n\n", i, params.prompt.c_str(), streams[i].c_str());
        }
    }

    // report timing
    {
        const int64_t t_main_end_us = ggml_time_us();

        printf("\n\n");
        printf("%s:     n_decoded = %8d\n",      __func__, n_decoded);
        printf("%s:     load time = %8.2f ms\n", __func__, t_load_us/1000.0f);
        printf("%s:   sample time = %8.2f ms\n", __func__, t_sample_us/1000.0f);
        printf("%s:  predict time = %8.2f ms\n", __func__, t_predict_us/1000.0f);
        printf("%s:    total time = %8.2f ms\n", __func__, (t_main_end_us - t_main_start_us)/1000.0f);
    }

    gpt2_batch_free(batch);
    ggml_free(model.ctx_w);

    ggml_gallocr_free(allocr);
    ggml_backend_buffer_free(model.buffer_w);
    ggml_backend_buffer_free(model.kv_cache.buffer);
    ggml_backend_free(model.backend);

    return 0;
}